

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::start_lsd(session_impl *this)

{
  session_impl *__args_1;
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  address local_98;
  undefined1 local_78 [8];
  error_code ec;
  io_context local_48;
  undefined1 local_33;
  uchar local_32;
  bitfield_flag local_31;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_30;
  shared_ptr<libtorrent::aux::listen_socket_t> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range2;
  session_impl *this_local;
  
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ::begin(&this->m_listen_sockets);
  s = (shared_ptr<libtorrent::aux::listen_socket_t> *)
      ::std::
      vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ::end(&this->m_listen_sockets);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                     *)&s), bVar1) {
    local_30 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                  ::operator*(&__end2);
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_30);
    local_32 = (peVar2->flags).m_val;
    local_33 = 8;
    local_31 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                           )local_32,
                          (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                           )0x8);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_31);
    if (!bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_30);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->lsd);
      if (!bVar1) {
        __args_1 = (session_impl *)this->m_io_context;
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_30);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  ((address *)&ec.cat_,&peVar2->local_endpoint);
        ::std::
        __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(local_30);
        ::std::
        make_shared<libtorrent::aux::lsd,boost::asio::io_context&,libtorrent::aux::session_impl&,boost::asio::ip::address,boost::asio::ip::address&>
                  (&local_48,__args_1,(address *)this,(address *)&ec.cat_);
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_30);
        ::std::shared_ptr<libtorrent::aux::lsd>::operator=
                  (&peVar2->lsd,(shared_ptr<libtorrent::aux::lsd> *)&local_48);
        ::std::shared_ptr<libtorrent::aux::lsd>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::lsd> *)&local_48);
        boost::system::error_code::error_code((error_code *)local_78);
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_30);
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar2->lsd);
        lsd::start(this_00,(error_code *)local_78);
        bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_78);
        if (bVar1) {
          bVar1 = alert_manager::should_post<libtorrent::lsd_error_alert>(&this->m_alerts);
          if (bVar1) {
            peVar2 = ::std::
                     __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(local_30);
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                      (&local_98,&peVar2->local_endpoint);
            alert_manager::
            emplace_alert<libtorrent::lsd_error_alert,boost::system::error_code&,boost::asio::ip::address>
                      (&this->m_alerts,(error_code *)local_78,&local_98);
          }
          peVar2 = ::std::
                   __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_30);
          ::std::__shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>::reset
                    (&(peVar2->lsd).
                      super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::start_lsd()
	{
		INVARIANT_CHECK;

		for (auto& s : m_listen_sockets)
		{
			// we're not looking for local peers when we're using a proxy. We
			// want all traffic to go through the proxy
			if (s->flags & listen_socket_t::proxy) continue;
			if (s->lsd) continue;
			s->lsd = std::make_shared<lsd>(m_io_context, *this, s->local_endpoint.address()
				, s->netmask);
			error_code ec;
			s->lsd->start(ec);
			if (ec)
			{
				if (m_alerts.should_post<lsd_error_alert>())
					m_alerts.emplace_alert<lsd_error_alert>(ec, s->local_endpoint.address());
				s->lsd.reset();
			}
		}
	}